

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# files.cpp
# Opt level: O2

void __thiscall BMP::writeInfo(BMP *this,ofstream *out)

{
  ostream *poVar1;
  
  if (out == (ofstream *)0x0) {
    out = (ofstream *)&std::cout;
  }
  std::operator<<((ostream *)out,"General Information of BMP Files\n");
  poVar1 = std::operator<<((ostream *)out,"bfType: ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(poVar1,'\n');
  poVar1 = std::operator<<((ostream *)out,"bfSize: ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(poVar1,'\n');
  poVar1 = std::operator<<((ostream *)out,"bfReserved1: ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(poVar1,'\n');
  poVar1 = std::operator<<((ostream *)out,"bfReserved2: ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(poVar1,'\n');
  poVar1 = std::operator<<((ostream *)out,"bfOffBits: ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(poVar1,'\n');
  std::operator<<((ostream *)out,"\nHeader Information of BMP Files\n");
  poVar1 = std::operator<<((ostream *)out,"biSize: ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(poVar1,'\n');
  poVar1 = std::operator<<((ostream *)out,"biWidth: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(this->headInfo).biWidth);
  std::operator<<(poVar1,'\n');
  poVar1 = std::operator<<((ostream *)out,"biHeight: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(this->headInfo).biHeight);
  std::operator<<(poVar1,'\n');
  poVar1 = std::operator<<((ostream *)out,"biPlanes: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(this->headInfo).biPlanes);
  std::operator<<(poVar1,'\n');
  poVar1 = std::operator<<((ostream *)out,"biBitCount: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(this->headInfo).biBitCount);
  std::operator<<(poVar1,'\n');
  poVar1 = std::operator<<((ostream *)out,"biCompression: ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(poVar1,'\n');
  poVar1 = std::operator<<((ostream *)out,"biSizeImage: ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(poVar1,'\n');
  poVar1 = std::operator<<((ostream *)out,"biXPelsPerMeter: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(this->headInfo).biXPelsPerMeter);
  std::operator<<(poVar1,'\n');
  poVar1 = std::operator<<((ostream *)out,"biYPelsPerMeter: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(this->headInfo).biYPelsPerMeter);
  std::operator<<(poVar1,'\n');
  poVar1 = std::operator<<((ostream *)out,"biClrUsed: ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(poVar1,'\n');
  poVar1 = std::operator<<((ostream *)out,"biClrImportant: ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(poVar1,'\n');
  return;
}

Assistant:

void BMP::writeInfo( std::ofstream *out ) {
    using namespace std;

    bool flag;
    if ( out != nullptr ) {
        flag = true;
    } else {
        flag = false;
    }

    if ( flag ) {
        ( *out ) << "General Information of BMP Files\n";
        ( *out ) << "bfType: " << head.bfType << '\n';
        ( *out ) << "bfSize: " << head.bfSize << '\n';
        ( *out ) << "bfReserved1: " << head.bfReserved1 << '\n';
        ( *out ) << "bfReserved2: " << head.bfReserved2 << '\n';
        ( *out ) << "bfOffBits: " << head.bfOffBits << '\n';

        ( *out ) << "\nHeader Information of BMP Files\n";
        ( *out ) << "biSize: " << headInfo.biSize << '\n';
        ( *out ) << "biWidth: " << headInfo.biWidth << '\n';
        ( *out ) << "biHeight: " << headInfo.biHeight << '\n';
        ( *out ) << "biPlanes: " << headInfo.biPlanes << '\n';
        ( *out ) << "biBitCount: " << headInfo.biBitCount << '\n';
        ( *out ) << "biCompression: " << headInfo.biCompression << '\n';
        ( *out ) << "biSizeImage: " << headInfo.biSizeImage << '\n';
        ( *out ) << "biXPelsPerMeter: " << headInfo.biXPelsPerMeter << '\n';
        ( *out ) << "biYPelsPerMeter: " << headInfo.biYPelsPerMeter << '\n';
        ( *out ) << "biClrUsed: " << headInfo.biClrUsed << '\n';
        ( *out ) << "biClrImportant: " << headInfo.biClrImportant << '\n';

    } else {
        cout << "General Information of BMP Files\n";
        cout << "bfType: " << head.bfType << '\n';
        cout << "bfSize: " << head.bfSize << '\n';
        cout << "bfReserved1: " << head.bfReserved1 << '\n';
        cout << "bfReserved2: " << head.bfReserved2 << '\n';
        cout << "bfOffBits: " << head.bfOffBits << '\n';

        cout << "\nHeader Information of BMP Files\n";
        cout << "biSize: " << headInfo.biSize << '\n';
        cout << "biWidth: " << headInfo.biWidth << '\n';
        cout << "biHeight: " << headInfo.biHeight << '\n';
        cout << "biPlanes: " << headInfo.biPlanes << '\n';
        cout << "biBitCount: " << headInfo.biBitCount << '\n';
        cout << "biCompression: " << headInfo.biCompression << '\n';
        cout << "biSizeImage: " << headInfo.biSizeImage << '\n';
        cout << "biXPelsPerMeter: " << headInfo.biXPelsPerMeter << '\n';
        cout << "biYPelsPerMeter: " << headInfo.biYPelsPerMeter << '\n';
        cout << "biClrUsed: " << headInfo.biClrUsed << '\n';
        cout << "biClrImportant: " << headInfo.biClrImportant << '\n';
    }
}